

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  Expr *zRight;
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar3 = 0;
  if ((char)pEList->nExpr == '<') {
    uVar2 = (ulong)*(uint *)&pParse->db;
    if ((int)*(uint *)&pParse->db < 1) {
      uVar2 = 0;
    }
    zRight = pEList->a[0].pExpr;
    iVar4 = 1;
    lVar5 = 0;
    while ((iVar3 = 0, uVar2 * 0x18 - lVar5 != 0 &&
           (((*(byte *)((long)&pParse->rc + lVar5 + 1) & 3) != 0 ||
            (iVar1 = sqlite3_stricmp(*(char **)((long)&pParse->pVdbe + lVar5),(char *)zRight),
            iVar3 = iVar4, iVar1 != 0))))) {
      iVar4 = iVar4 + 1;
      lVar5 = lVar5 + 0x18;
    }
  }
  return iVar3;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    const char *zCol;
    assert( !ExprHasProperty(pE, EP_IntValue) );
    zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      if( pEList->a[i].fg.eEName==ENAME_NAME
       && sqlite3_stricmp(pEList->a[i].zEName, zCol)==0
      ){
        return i+1;
      }
    }
  }
  return 0;
}